

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-trace.cpp
# Opt level: O3

void __thiscall testDebugTrace::test_method(testDebugTrace *this)

{
  _Alloc_hider _Var1;
  char cVar2;
  int iVar3;
  string *psVar4;
  long lVar5;
  CustomEntity *this_00;
  istream *piVar6;
  bool bVar7;
  string astr;
  string str_to_test;
  string asubstr2;
  char *local_5c0;
  undefined8 local_5b8;
  shared_count sStack_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  output_test_stream output;
  undefined8 *local_528;
  char **local_520;
  fstream the_debug_file;
  undefined8 *local_3a8;
  string *local_3a0;
  ostringstream oss_debug_file;
  ios_base local_138 [264];
  
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_548,0x3c);
  _oss_debug_file = &PTR__lazy_ostream_00108c18;
  iVar3 = std::__cxx11::string::compare(dynamicgraph::CustomEntity::CLASS_NAME_abi_cxx11_);
  astr._M_dataplus._M_p._0_1_ = iVar3 == 0;
  astr._M_string_length = 0;
  astr.field_2._M_allocated_capacity = 0;
  str_to_test._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
  ;
  str_to_test._M_string_length =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
       + 0x66;
  local_3a0 = &asubstr2;
  asubstr2._M_dataplus._M_p = dynamicgraph::CustomEntity::CLASS_NAME_abi_cxx11_;
  _the_debug_file = &PTR__lazy_ostream_00108c68;
  local_3a8 = &boost::unit_test::lazy_ostream::inst;
  local_520 = &local_5c0;
  local_5c0 = "CustomEntity";
  _output = &PTR__lazy_ostream_00108ca8;
  local_528 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&astr,&oss_debug_file,&str_to_test,0x3c,1,2,2,"dynamicgraph::CustomEntity::CLASS_NAME",
             &the_debug_file,"\"CustomEntity\"",&output);
  boost::detail::shared_count::~shared_count((shared_count *)&astr.field_2._M_allocated_capacity);
  psVar4 = (string *)dynamicgraph::FactoryStorage::getInstance();
  _the_debug_file = (undefined **)&local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&the_debug_file,"CustomEntity","");
  _output = (undefined **)&local_528;
  std::__cxx11::string::_M_construct<char_const*>((string *)&output,"my-entity","");
  lVar5 = dynamicgraph::FactoryStorage::newEntity(psVar4,(string *)&the_debug_file);
  if (lVar5 == 0) {
    this_00 = (CustomEntity *)0x0;
  }
  else {
    this_00 = (CustomEntity *)
              __dynamic_cast(lVar5,&dynamicgraph::Entity::typeinfo,
                             &dynamicgraph::CustomEntity::typeinfo,0);
  }
  if ((undefined8 **)_output != &local_528) {
    operator_delete(_output,(long)local_528 + 1);
  }
  if ((undefined8 **)_the_debug_file != &local_3a8) {
    operator_delete(_the_debug_file,(long)local_3a8 + 1);
  }
  dynamicgraph::CustomEntity::testDebugTrace(this_00);
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_568,1,1);
  std::fstream::fstream(&the_debug_file);
  std::fstream::open((char *)&the_debug_file,
                     (_Ios_Openmode)dynamicgraph::DebugTrace::DEBUG_FILENAME_DEFAULT);
  astr._M_string_length = 0;
  astr.field_2._M_allocated_capacity = astr.field_2._M_allocated_capacity & 0xffffffffffffff00;
  astr._M_dataplus._M_p = (pointer)&astr.field_2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_debug_file);
  while( true ) {
    cVar2 = std::ios::widen((char)((undefined8 **)_the_debug_file)[-3] +
                            (char)(istream *)&the_debug_file);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&the_debug_file,(string *)&astr,cVar2);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::find((char *)&astr,0x10619e,0);
    std::__cxx11::string::substr((ulong)&str_to_test,(ulong)&astr);
    std::__cxx11::string::find((char *)&str_to_test,0x10619e,0);
    std::__cxx11::string::substr((ulong)&asubstr2,(ulong)&str_to_test);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&oss_debug_file,asubstr2._M_dataplus._M_p,
               CONCAT71(asubstr2._M_string_length._1_7_,(undefined1)asubstr2._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)asubstr2._M_dataplus._M_p != &asubstr2.field_2) {
      operator_delete(asubstr2._M_dataplus._M_p,asubstr2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str_to_test._M_dataplus._M_p != &str_to_test.field_2) {
      operator_delete(str_to_test._M_dataplus._M_p,str_to_test.field_2._M_allocated_capacity + 1);
    }
  }
  std::fstream::close();
  str_to_test._M_dataplus._M_p = (pointer)&str_to_test.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&str_to_test,"# In {# In/Out { }Here is a test# Out }","");
  std::__cxx11::stringbuf::str();
  _Var1 = asubstr2._M_dataplus;
  if (str_to_test._M_string_length ==
      CONCAT71(asubstr2._M_string_length._1_7_,(undefined1)asubstr2._M_string_length)) {
    if (str_to_test._M_string_length == 0) {
      bVar7 = true;
    }
    else {
      iVar3 = bcmp(str_to_test._M_dataplus._M_p,asubstr2._M_dataplus._M_p,
                   str_to_test._M_string_length);
      bVar7 = iVar3 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != &asubstr2.field_2) {
    operator_delete(_Var1._M_p,asubstr2.field_2._M_allocated_capacity + 1);
  }
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_578,0x65);
  local_5c0 = (char *)CONCAT71(local_5c0._1_7_,bVar7);
  local_5b8 = 0;
  sStack_5b0.pi_ = (sp_counted_base *)0x0;
  asubstr2.field_2._8_8_ = &local_598;
  local_598 = "two_sub_string_identical";
  local_590 = "";
  asubstr2._M_string_length._0_1_ = 0;
  asubstr2._M_dataplus._M_p = "lZ\x10";
  asubstr2.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
  ;
  local_5a0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5b0);
  (**(code **)(*(long *)this_00 + 8))();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str_to_test._M_dataplus._M_p != &str_to_test.field_2) {
    operator_delete(str_to_test._M_dataplus._M_p,str_to_test.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_debug_file);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)astr._M_dataplus._M_p != &astr.field_2) {
    operator_delete(astr._M_dataplus._M_p,astr.field_2._M_allocated_capacity + 1);
  }
  std::fstream::~fstream(&the_debug_file);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testDebugTrace) {
  BOOST_CHECK_EQUAL(dynamicgraph::CustomEntity::CLASS_NAME, "CustomEntity");

  dynamicgraph::CustomEntity *ptr_entity =
      (dynamic_cast<dynamicgraph::CustomEntity *>(
          dynamicgraph::FactoryStorage::getInstance()->newEntity("CustomEntity",

                                                                 "my-entity")));

  dynamicgraph::CustomEntity &entity = *ptr_entity;
  entity.testDebugTrace();

  /// Copy the debug file into the oss_debug_file
  output_test_stream output;
  std::fstream the_debug_file;
  the_debug_file.open(dynamicgraph::DebugTrace::DEBUG_FILENAME_DEFAULT,
                      std::ios::in);

  // Extract the filename and this source file from the output
  std::string astr;
  std::ostringstream oss_debug_file;
  while (std::getline(the_debug_file, astr)) {
    std::size_t found = astr.find(":");
    std::string asubstr = astr.substr(found + 1, astr.length());
    found = asubstr.find(":");
    std::string asubstr2 = asubstr.substr(found + 1, astr.length());
    oss_debug_file << asubstr2;
  }

  the_debug_file.close();

  // Compare with the strings put inside this source file
  std::string str_to_test =
      "# In {"
      "# In/Out { }"
      "Here is a test"
      "# Out }";
  bool two_sub_string_identical;

  // Make comparisons.
  two_sub_string_identical = str_to_test == oss_debug_file.str();

  BOOST_CHECK(two_sub_string_identical);

  delete ptr_entity;
}